

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Runner::~Runner(Runner *this)

{
  IStreamingReporter *pIVar1;
  Config *pCVar2;
  long lVar3;
  undefined8 uVar4;
  
  std::
  _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
  ::~_Rb_tree(&(this->m_testsAlreadyRun)._M_t);
  pIVar1 = (this->m_reporter).m_p;
  if (pIVar1 != (IStreamingReporter *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  uVar4 = _memcpy;
  lVar3 = _VTT;
  *(long *)&this->m_ofs = _VTT;
  *(undefined8 *)(&this->m_ofs + *(long *)(lVar3 + -0x18)) = uVar4;
  std::filebuf::~filebuf((filebuf *)&this->field_0x10);
  std::ios_base::~ios_base((ios_base *)&this->field_0x100);
  pCVar2 = (this->m_config).m_p;
  if (pCVar2 != (Config *)0x0) {
    (*(pCVar2->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
      _vptr_NonCopyable[3])();
  }
  return;
}

Assistant:

Runner( Ptr<Config> const& config )
        :   m_config( config )
        {
            openStream();
            makeReporter();
        }